

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

token * libchars::lexer(string *str)

{
  uint uVar1;
  token *ptVar2;
  int iVar3;
  token *this;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  long *local_68 [2];
  long local_58 [2];
  token *local_48;
  token *local_40;
  string *local_38;
  
  uVar7 = 0;
  uVar8 = 0;
  this = (token *)0x0;
  local_48 = (token *)0x0;
  uVar5 = 0;
  local_38 = str;
  do {
    local_40 = (token *)str->_M_string_length;
    iVar6 = 0;
    if (uVar5 < local_40) {
      iVar6 = (int)(str->_M_dataplus)._M_p[uVar5];
    }
    if (iVar6 == 0) {
      uVar4 = 4;
    }
    else if (iVar6 == 0x22) {
      uVar4 = 2;
    }
    else if (iVar6 == 0x5c) {
      uVar4 = 3;
    }
    else {
      iVar3 = isspace(iVar6);
      str = local_38;
      if (iVar6 == 0x3d) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        if (iVar3 == 0) {
          iVar6 = isprint(iVar6);
          uVar4 = (ulong)(iVar6 != 0);
          str = local_38;
        }
      }
    }
    uVar1 = *(uint *)(lex_transitions + uVar4 * 4 + uVar7 * 0x14);
    ptVar2 = local_48;
    if ((((uVar1 & 0xc0) != 0) && (uVar8 < uVar5)) && (uVar8 < local_40)) {
      local_40 = this;
      this = (token *)operator_new(0x90);
      token::token(this,UNKNOWN,-1,0,(char *)0x0);
      this->status = (uint)(((int)uVar7 - 2U & 0xfffffffd) == 0) << 10 | 0x10;
      this->offset = uVar8;
      this->length = (uVar5 + ((uVar1 >> 7 & 1) != 0)) - uVar8;
      std::__cxx11::string::substr((ulong)local_68,(ulong)local_38);
      std::__cxx11::string::operator=((string *)this,(string *)local_68);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      str = local_38;
      ptVar2 = this;
      if (local_40 != (token *)0x0) {
        local_40->next = this;
        ptVar2 = local_48;
      }
    }
    local_48 = ptVar2;
    if ((uVar1 & 0x10) != 0) {
      uVar8 = uVar5;
    }
    uVar7 = (ulong)(uVar1 & 0xf);
    bVar9 = uVar5 < str->_M_string_length;
    uVar5 = uVar5 + 1;
  } while (bVar9);
  return local_48;
}

Assistant:

token *lexer(const std::string &str)
    {
        token *t_tail = NULL;
        token *t_head = NULL;
        size_t offset = 0, offset_start = 0;
        uint32_t state = S_WS;
        do {
            char c = (offset < str.length()) ? str.at(offset) : 0;
            lex_inputs x = X_WS;
            if (c == 0)
                x = X_EOL;
            else if (c == '\\')
                x = X_ESC;
            else if (c == '"')
                x = X_Q;
            else if (isspace(c) || c == '=')
                x = X_WS;
            else if (isprint(c))
                x = X_A0;

            uint32_t tr = lex_transitions[state][x];
            if ((tr & (A_PUSH|A_EOTP)) != 0) {
                // character part of existing token
            }
            if ((tr & (A_EOT|A_EOTP)) != 0) {
                // end of token (if not empty)
                if (offset > offset_start && offset_start < str.length()) {
                    token *T = new token;
                    T->status = token::IN_STRING;
                    if (state == S_STR || state == S_E2)
                        T->status |= token::IS_QUOTED;
                    T->offset = offset_start;
                    T->length = offset - offset_start;
                    if (tr & A_EOTP) ++T->length;
                    T->value = str.substr(T->offset,T->length);
                    if (t_head == NULL) {
                        t_head = t_tail = T;
                    }
                    else {
                        t_head->next = T;
                        t_head = T;
                    }
                }
            }
            if ((tr & A_SOT) != 0) {
                // new token
                offset_start = offset;
            }
            state = tr & 0x0f;
        } while (offset++ < str.length());

        return t_tail;
    }